

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O0

ParticleUpperBound * __thiscall
despot::DSPOMDP::CreateParticleUpperBound(DSPOMDP *this,string *name)

{
  bool bVar1;
  TrivialParticleUpperBound *this_00;
  ostream *poVar2;
  string *name_local;
  DSPOMDP *this_local;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
    bVar1 = std::operator!=(name,"print");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Supported types: TRIVIAL (default)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  this_00 = (TrivialParticleUpperBound *)operator_new(0x10);
  TrivialParticleUpperBound::TrivialParticleUpperBound(this_00,this);
  return &this_00->super_ParticleUpperBound;
}

Assistant:

ParticleUpperBound* DSPOMDP::CreateParticleUpperBound(string name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported base upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL (default)" << endl;
		exit(1);
	}
}